

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowDecorations
               (ImGuiWindow *window,ImRect *title_bar_rect,bool title_bar_is_highlight,
               int resize_grip_count,ImU32 *resize_grip_col,float resize_grip_draw_size)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiCol IVar3;
  uint uVar4;
  ImU32 IVar5;
  ImRect *pIVar6;
  ImVec2 *pIVar7;
  ImDrawCornerFlags rounding_corners;
  float fVar8;
  ImRect IVar9;
  float local_194;
  byte local_139;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  ImVec2 IStack_e0;
  int resize_grip_n;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImRect local_b0;
  undefined1 local_a0 [8];
  ImRect menu_bar_rect;
  ImU32 title_bar_col_1;
  ImVec2 local_84;
  ImVec2 local_7c;
  float local_74;
  undefined1 local_6d;
  float alpha;
  bool override_alpha;
  ImVec2 IStack_68;
  ImU32 bg_col;
  ImVec2 local_60;
  ImU32 local_54;
  float local_50;
  ImU32 title_bar_col;
  float backup_border_size;
  float window_border_size;
  float window_rounding;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImU32 *pIStack_28;
  float resize_grip_draw_size_local;
  ImU32 *resize_grip_col_local;
  int resize_grip_count_local;
  bool title_bar_is_highlight_local;
  ImRect *title_bar_rect_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  style = (ImGuiStyle *)GImGui;
  _window_rounding = &GImGui->Style;
  window_border_size = (float)window->Flags;
  window->SkipItems = false;
  backup_border_size = window->WindowRounding;
  title_bar_col = (ImU32)window->WindowBorderSize;
  g._4_4_ = resize_grip_draw_size;
  pIStack_28 = resize_grip_col;
  resize_grip_col_local._0_4_ = resize_grip_count;
  resize_grip_col_local._7_1_ = title_bar_is_highlight;
  _resize_grip_count_local = title_bar_rect;
  title_bar_rect_local = (ImRect *)window;
  if ((window->Collapsed & 1U) == 0) {
    if (((uint)window_border_size & 0x80) == 0) {
      IVar3 = GetWindowBgColorIdxFromFlags((ImGuiWindowFlags)window_border_size);
      alpha = (float)GetColorU32(IVar3,1.0);
      local_74 = 1.0;
      local_6d = ((uint)style[7].Colors[6].x & 0x40) != 0;
      if ((bool)local_6d) {
        local_74 = style[7].Colors[0xc].x;
        uVar4 = (uint)alpha & 0xffffff;
        fVar8 = ImSaturate(local_74);
        alpha = (float)(uVar4 | (int)(fVar8 * 255.0 + 0.5) << 0x18);
      }
      IVar1 = title_bar_rect_local[0x2b].Min;
      pIVar6 = title_bar_rect_local + 1;
      fVar8 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)title_bar_rect_local);
      ImVec2::ImVec2(&local_84,0.0,fVar8);
      local_7c = operator+(&pIVar6->Min,&local_84);
      register0x00001200 = operator+(&title_bar_rect_local[1].Min,&title_bar_rect_local[1].Max);
      rounding_corners = 0xc;
      if (((uint)window_border_size & 1) != 0) {
        rounding_corners = 0xf;
      }
      ImDrawList::AddRectFilled
                ((ImDrawList *)IVar1,&local_7c,(ImVec2 *)&menu_bar_rect.Max.y,(ImU32)alpha,
                 backup_border_size,rounding_corners);
    }
    if (((uint)window_border_size & 1) == 0) {
      IVar3 = 10;
      if ((resize_grip_col_local._7_1_ & 1) != 0) {
        IVar3 = 0xb;
      }
      menu_bar_rect.Max.x = (float)GetColorU32(IVar3,1.0);
      ImDrawList::AddRectFilled
                ((ImDrawList *)title_bar_rect_local[0x2b].Min,&_resize_grip_count_local->Min,
                 &_resize_grip_count_local->Max,(ImU32)menu_bar_rect.Max.x,backup_border_size,3);
    }
    if (((uint)window_border_size & 0x400) != 0) {
      IVar9 = ImGuiWindow::MenuBarRect((ImGuiWindow *)title_bar_rect_local);
      menu_bar_rect.Min = IVar9.Max;
      local_a0 = (undefined1  [8])IVar9.Min;
      local_b0 = ImGuiWindow::Rect((ImGuiWindow *)title_bar_rect_local);
      ImRect::ClipWith((ImRect *)local_a0,&local_b0);
      IVar1 = title_bar_rect_local[0x2b].Min;
      ImVec2::ImVec2(&local_c0,(float)title_bar_col,0.0);
      local_b8 = operator+((ImVec2 *)local_a0,&local_c0);
      ImVec2::ImVec2(&local_d0,(float)title_bar_col,0.0);
      local_c8 = operator-(&menu_bar_rect.Min,&local_d0);
      IVar5 = GetColorU32(0xd,1.0);
      if (((uint)window_border_size & 1) == 0) {
        local_194 = 0.0;
      }
      else {
        local_194 = backup_border_size;
      }
      ImDrawList::AddRectFilled((ImDrawList *)IVar1,&local_b8,&local_c8,IVar5,local_194,3);
      if ((0.0 < _window_rounding->FrameBorderSize) &&
         (menu_bar_rect.Min.y < title_bar_rect_local[1].Min.y + title_bar_rect_local[1].Max.y)) {
        IVar1 = title_bar_rect_local[0x2b].Min;
        local_d8 = ImRect::GetBL((ImRect *)local_a0);
        IStack_e0 = ImRect::GetBR((ImRect *)local_a0);
        IVar5 = GetColorU32(5,1.0);
        ImDrawList::AddLine((ImDrawList *)IVar1,&local_d8,&stack0xffffffffffffff20,IVar5,
                            _window_rounding->FrameBorderSize);
      }
    }
    if (((uint)title_bar_rect_local[7].Max.y & 1) != 0) {
      Scrollbar(ImGuiAxis_X);
    }
    if (((uint)title_bar_rect_local[7].Max.y & 0x100) != 0) {
      Scrollbar(ImGuiAxis_Y);
    }
    if (((uint)window_border_size & 2) == 0) {
      for (grip._4_4_ = 0; (int)grip._4_4_ < (int)resize_grip_col_local; grip._4_4_ = grip._4_4_ + 1
          ) {
        corner = (ImVec2)(resize_grip_def + (int)grip._4_4_);
        pIVar6 = title_bar_rect_local + 1;
        local_100 = operator+(&pIVar6->Min,&title_bar_rect_local[1].Max);
        local_f8 = ImLerp(&pIVar6->Min,&local_100,(ImVec2 *)corner);
        IVar1 = title_bar_rect_local[0x2b].Min;
        pIVar7 = (ImVec2 *)((long)corner + 8);
        if ((grip._4_4_ & 1) == 0) {
          ImVec2::ImVec2(&local_118,g._4_4_,(float)title_bar_col);
        }
        else {
          ImVec2::ImVec2(&local_118,(float)title_bar_col,g._4_4_);
        }
        local_110 = operator*(pIVar7,&local_118);
        local_108 = operator+(&local_f8,&local_110);
        ImDrawList::PathLineTo((ImDrawList *)IVar1,&local_108);
        IVar1 = title_bar_rect_local[0x2b].Min;
        pIVar7 = (ImVec2 *)((long)corner + 8);
        if ((grip._4_4_ & 1) == 0) {
          ImVec2::ImVec2(&local_130,(float)title_bar_col,g._4_4_);
        }
        else {
          ImVec2::ImVec2(&local_130,g._4_4_,(float)title_bar_col);
        }
        local_128 = operator*(pIVar7,&local_130);
        local_120 = operator+(&local_f8,&local_128);
        ImDrawList::PathLineTo((ImDrawList *)IVar1,&local_120);
        IVar1 = title_bar_rect_local[0x2b].Min;
        ImVec2::ImVec2(&local_138,
                       *(float *)((long)corner + 8) * (backup_border_size + (float)title_bar_col) +
                       local_f8.x,
                       *(float *)((long)corner + 0xc) * (backup_border_size + (float)title_bar_col)
                       + local_f8.y);
        ImDrawList::PathArcToFast
                  ((ImDrawList *)IVar1,&local_138,backup_border_size,*(int *)((long)corner + 0x10),
                   *(int *)((long)corner + 0x14));
        ImDrawList::PathFillConvex
                  ((ImDrawList *)title_bar_rect_local[0x2b].Min,pIStack_28[(int)grip._4_4_]);
      }
    }
    RenderWindowOuterBorders((ImGuiWindow *)title_bar_rect_local);
  }
  else {
    local_50 = (pIVar2->Style).FrameBorderSize;
    (pIVar2->Style).FrameBorderSize = window->WindowBorderSize;
    local_139 = 0;
    if (title_bar_is_highlight) {
      local_139 = pIVar2->NavDisableHighlight ^ 0xff;
    }
    local_54 = GetColorU32(0xc - (local_139 & 1),1.0);
    local_60 = _resize_grip_count_local->Min;
    IStack_68 = _resize_grip_count_local->Max;
    RenderFrame(local_60,IStack_68,local_54,true,backup_border_size);
    style[5].Colors[0x25].w = local_50;
  }
  return;
}

Assistant:

void ImGui::RenderWindowDecorations(ImGuiWindow* window, const ImRect& title_bar_rect, bool title_bar_is_highlight, int resize_grip_count, const ImU32 resize_grip_col[4], float resize_grip_draw_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    // Ensure that ScrollBar doesn't read last frame's SkipItems
    window->SkipItems = false;

    // Draw window + handle manual resize
    // As we highlight the title bar when want_focus is set, multiple reappearing windows will have have their title bar highlighted on their reappearing frame.
    const float window_rounding = window->WindowRounding;
    const float window_border_size = window->WindowBorderSize;
    if (window->Collapsed)
    {
        // Title bar only
        float backup_border_size = style.FrameBorderSize;
        g.Style.FrameBorderSize = window->WindowBorderSize;
        ImU32 title_bar_col = GetColorU32((title_bar_is_highlight && !g.NavDisableHighlight) ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBgCollapsed);
        RenderFrame(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, true, window_rounding);
        g.Style.FrameBorderSize = backup_border_size;
    }
    else
    {
        // Window background
        if (!(flags & ImGuiWindowFlags_NoBackground))
        {
            ImU32 bg_col = GetColorU32(GetWindowBgColorIdxFromFlags(flags));
            bool override_alpha = false;
            float alpha = 1.0f;
            if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasBgAlpha)
            {
                alpha = g.NextWindowData.BgAlphaVal;
                override_alpha = true;
            }
            if (override_alpha)
                bg_col = (bg_col & ~IM_COL32_A_MASK) | (IM_F32_TO_INT8_SAT(alpha) << IM_COL32_A_SHIFT);
            window->DrawList->AddRectFilled(window->Pos + ImVec2(0, window->TitleBarHeight()), window->Pos + window->Size, bg_col, window_rounding, (flags & ImGuiWindowFlags_NoTitleBar) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Bot);
        }

        // Title bar
        if (!(flags & ImGuiWindowFlags_NoTitleBar))
        {
            ImU32 title_bar_col = GetColorU32(title_bar_is_highlight ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg);
            window->DrawList->AddRectFilled(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, window_rounding, ImDrawCornerFlags_Top);
        }

        // Menu bar
        if (flags & ImGuiWindowFlags_MenuBar)
        {
            ImRect menu_bar_rect = window->MenuBarRect();
            menu_bar_rect.ClipWith(window->Rect());  // Soft clipping, in particular child window don't have minimum size covering the menu bar so this is useful for them.
            window->DrawList->AddRectFilled(menu_bar_rect.Min + ImVec2(window_border_size, 0), menu_bar_rect.Max - ImVec2(window_border_size, 0), GetColorU32(ImGuiCol_MenuBarBg), (flags & ImGuiWindowFlags_NoTitleBar) ? window_rounding : 0.0f, ImDrawCornerFlags_Top);
            if (style.FrameBorderSize > 0.0f && menu_bar_rect.Max.y < window->Pos.y + window->Size.y)
                window->DrawList->AddLine(menu_bar_rect.GetBL(), menu_bar_rect.GetBR(), GetColorU32(ImGuiCol_Border), style.FrameBorderSize);
        }

        // Scrollbars
        if (window->ScrollbarX)
            Scrollbar(ImGuiAxis_X);
        if (window->ScrollbarY)
            Scrollbar(ImGuiAxis_Y);

        // Render resize grips (after their input handling so we don't have a frame of latency)
        if (!(flags & ImGuiWindowFlags_NoResize))
        {
            for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
            {
                const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
                const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(window_border_size, resize_grip_draw_size) : ImVec2(resize_grip_draw_size, window_border_size)));
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(resize_grip_draw_size, window_border_size) : ImVec2(window_border_size, resize_grip_draw_size)));
                window->DrawList->PathArcToFast(ImVec2(corner.x + grip.InnerDir.x * (window_rounding + window_border_size), corner.y + grip.InnerDir.y * (window_rounding + window_border_size)), window_rounding, grip.AngleMin12, grip.AngleMax12);
                window->DrawList->PathFillConvex(resize_grip_col[resize_grip_n]);
            }
        }

        // Borders
        RenderWindowOuterBorders(window);
    }
}